

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::Schema> __thiscall capnp::compiler::Compiler::Node::getBootstrapSchema(Node *this)

{
  char cVar1;
  long lVar2;
  Schema SVar3;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar4;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  long in_RSI;
  Reader *reader;
  Maybe<capnp::Schema> MVar5;
  Resolver local_20;
  
  if (*(char *)(in_RSI + 0x188) == '\x01') {
    reader = (Reader *)(in_RSI + 400);
    lVar2 = **(long **)(in_RSI + 8);
LAB_003eeb72:
    SVar3 = SchemaLoader::loadOnce((SchemaLoader *)(lVar2 + 0x188),reader);
    *(undefined1 *)&(this->super_Resolver)._vptr_Resolver = 1;
    aVar4 = extraout_RDX;
LAB_003eeb7a:
    this->module = (CompiledModule *)SVar3.raw;
  }
  else {
    getContent((Node *)&stack0xffffffffffffffe0,(State)in_RSI);
    aVar4 = extraout_RDX_00;
    if (local_20._vptr_Resolver != (_func_int **)0x0) {
      if ((*(int *)local_20._vptr_Resolver != 3) ||
         (*(char *)(local_20._vptr_Resolver + 0x12) != '\0')) {
        cVar1 = *(char *)(local_20._vptr_Resolver + 0x12);
        *(char *)&(this->super_Resolver)._vptr_Resolver = cVar1;
        if (cVar1 != '\x01') goto LAB_003eebe1;
        SVar3.raw = (RawBrandedSchema *)local_20._vptr_Resolver[0x13];
        goto LAB_003eeb7a;
      }
      if (*(char *)(local_20._vptr_Resolver + 0x14) == '\x01') {
        reader = (Reader *)(local_20._vptr_Resolver + 0x15);
        lVar2 = **(long **)(in_RSI + 8);
        goto LAB_003eeb72;
      }
    }
    *(undefined1 *)&(this->super_Resolver)._vptr_Resolver = 0;
  }
LAB_003eebe1:
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar5.ptr;
}

Assistant:

kj::Maybe<Schema> Compiler::Node::getBootstrapSchema() {
  KJ_IF_SOME(schema, loadedFinalSchema) {
    // We don't need to rebuild the bootstrap schema if we already have a final schema.
    return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(schema);
  } else KJ_IF_SOME(content, getContent(Content::BOOTSTRAP)) {
    if (content.state == Content::FINISHED && content.bootstrapSchema == kj::none) {
      // The bootstrap schema was discarded.  Copy it from the final schema.
      // (We can't just return the final schema because using it could trigger schema loader
      // callbacks that would deadlock.)
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(finalSchema);
      } else {
        return kj::none;
      }
    } else {
      return content.bootstrapSchema;
    }